

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VClone(N_Vector W,sunindextype local_length,int myid)

{
  int iVar1;
  long lVar2;
  uint in_EDX;
  N_Vector in_RDI;
  N_Vector X_00;
  double dVar3;
  N_Vector X;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  undefined4 in_stack_ffffffffffffffe0;
  int local_4;
  
  if (in_RDI->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0) {
    printf(">>> FAILED test -- N_VClone, Proc %d missing required operations\n",(ulong)in_EDX);
    local_4 = 1;
  }
  else {
    X_00 = (N_Vector)get_time();
    lVar2 = N_VClone(in_RDI);
    dVar3 = get_time();
    if (lVar2 == 0) {
      printf(">>> FAILED test -- N_VClone, Proc %d \n",(ulong)in_EDX);
      printf("    After N_VClone, X == NULL \n\n");
      local_4 = 1;
    }
    else {
      iVar1 = has_data((N_Vector)0x103985);
      if (iVar1 == 0) {
        printf(">>> FAILED test -- N_VClone, Proc %d \n",(ulong)in_EDX);
        printf("    Vector data == NULL \n\n");
        N_VDestroy(lVar2);
        local_4 = 1;
      }
      else {
        N_VConst(0x3ff0000000000000,lVar2);
        iVar1 = check_ans((sunrealtype)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),X_00,
                          (sunindextype)dVar3);
        if (iVar1 == 0) {
          N_VDestroy(lVar2);
          if (in_EDX == 0) {
            printf("PASSED test -- N_VClone \n");
          }
          dVar3 = max_time(in_RDI,dVar3 - (double)X_00);
          if (print_time != 0) {
            printf("%s Time: %22.15e\n\n",dVar3,"N_VClone");
          }
          local_4 = 0;
        }
        else {
          printf(">>> FAILED test -- N_VClone, Proc %d \n",(ulong)in_EDX);
          printf("    Failed N_VClone check \n\n");
          N_VDestroy(lVar2);
          local_4 = 1;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int Test_N_VClone(N_Vector W, sunindextype local_length, int myid)
{
  int failure;
  double start_time, stop_time, maxt;
  N_Vector X;

  /* check if the required operations are implemented */
  if (W->ops->nvconst == NULL)
  {
    printf(">>> FAILED test -- N_VClone, Proc %d missing required operations\n",
           myid);
    return (1);
  }

  /* clone vector */
  start_time = get_time();
  X          = N_VClone(W);
  stop_time  = get_time();

  /* check cloned vector */
  if (X == NULL)
  {
    printf(">>> FAILED test -- N_VClone, Proc %d \n", myid);
    printf("    After N_VClone, X == NULL \n\n");
    return (1);
  }

  /* check cloned vector data */
  if (!has_data(X))
  {
    printf(">>> FAILED test -- N_VClone, Proc %d \n", myid);
    printf("    Vector data == NULL \n\n");
    N_VDestroy(X);
    return (1);
  }

  N_VConst(ONE, X);
  failure = check_ans(ONE, X, local_length);
  if (failure)
  {
    printf(">>> FAILED test -- N_VClone, Proc %d \n", myid);
    printf("    Failed N_VClone check \n\n");
    N_VDestroy(X);
    return (1);
  }
  N_VDestroy(X);

  if (myid == 0) { printf("PASSED test -- N_VClone \n"); }

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VClone", maxt);

  return (0);
}